

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall
ImGuiInputTextCallbackData::DeleteChars(ImGuiInputTextCallbackData *this,int pos,int bytes_count)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char c;
  char *src;
  char *dst;
  char *local_20;
  char *local_18;
  
  if (*(int *)(in_RDI + 0x20) < in_ESI + in_EDX) {
    __assert_fail("pos + bytes_count <= BufTextLen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0xe6d,"void ImGuiInputTextCallbackData::DeleteChars(int, int)");
  }
  local_20 = (char *)(*(long *)(in_RDI + 0x18) + (long)in_ESI + (long)in_EDX);
  local_18 = (char *)(*(long *)(in_RDI + 0x18) + (long)in_ESI);
  while( true ) {
    if (*local_20 == '\0') break;
    *local_18 = *local_20;
    local_20 = local_20 + 1;
    local_18 = local_18 + 1;
  }
  *local_18 = '\0';
  if (*(int *)(in_RDI + 0x2c) < in_ESI + in_EDX) {
    if (in_ESI <= *(int *)(in_RDI + 0x2c)) {
      *(int *)(in_RDI + 0x2c) = in_ESI;
    }
  }
  else {
    *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) - in_EDX;
  }
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x2c);
  *(undefined4 *)(in_RDI + 0x30) = *(undefined4 *)(in_RDI + 0x2c);
  *(undefined1 *)(in_RDI + 0x28) = 1;
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - in_EDX;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::DeleteChars(int pos, int bytes_count)
{
    IM_ASSERT(pos + bytes_count <= BufTextLen);
    char* dst = Buf + pos;
    const char* src = Buf + pos + bytes_count;
    while (char c = *src++)
        *dst++ = c;
    *dst = '\0';

    if (CursorPos >= pos + bytes_count)
        CursorPos -= bytes_count;
    else if (CursorPos >= pos)
        CursorPos = pos;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen -= bytes_count;
}